

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_com.c
# Opt level: O2

RK_S32 hal_h265d_slice_output_rps(void *dxva,void *rps_buf)

{
  ushort uVar1;
  ushort uVar2;
  RK_U8 RVar3;
  RK_U64 *ptr;
  byte bVar4;
  MPP_RET MVar5;
  RK_S32 num_bits;
  RK_S32 RVar6;
  RK_U32 RVar7;
  RK_U8 *pRVar8;
  byte bVar9;
  RefPicList_t *pRVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  void *pvVar20;
  bool bVar21;
  RK_S32 _out;
  RK_U64 *local_9a38;
  ulong local_9a30;
  RK_U8 *local_9a28;
  ulong local_9a20;
  void *local_9a18;
  RK_S32 local_9a10;
  int local_9a0c;
  BitReadCtx_t gb_cxt;
  SliceHeader_t local_99a8;
  RefPicListTab_t ref;
  RK_U8 lowdelay_flag [600];
  RK_U8 rps_bit_offset [600];
  RK_U8 slice_nb_rps_poc [600];
  RK_U8 rps_bit_offset_st [600];
  slice_ref_map_t rps_pic_info [600] [2] [15];
  
  memset(rps_pic_info,0,36000);
  memset(slice_nb_rps_poc,0,600);
  memset(rps_bit_offset,0,600);
  memset(rps_bit_offset_st,0,600);
  local_9a18 = memset(lowdelay_flag,0,600);
  uVar17 = 0;
  local_9a28 = (RK_U8 *)0x0;
  do {
    if (*(uint *)((long)dxva + 0x1e54) <= uVar17) {
      local_9a30 = (ulong)((int)local_9a28 + 1);
      RVar7 = (int)local_9a28 * 4 + 5;
      local_9a38 = (RK_U64 *)mpp_osal_malloc("hal_h265d_slice_output_rps",(long)(int)RVar7 * 8);
      mpp_set_bitput_ctx((BitputCtx_t *)&ref,local_9a38,RVar7);
      pRVar8 = &rps_pic_info[0][0][0].is_long_term;
      for (uVar17 = 0; ptr = local_9a38, uVar17 != local_9a30; uVar17 = uVar17 + 1) {
        pvVar20 = (void *)0x0;
        local_9a28 = pRVar8;
        local_9a20 = uVar17;
        while (uVar17 = local_9a20, pvVar20 != (void *)0x2) {
          local_9a18 = pvVar20;
          for (lVar14 = 0; lVar14 != 0xf; lVar14 = lVar14 + 1) {
            mpp_put_bits((BitputCtx_t *)&ref,(ulong)pRVar8[lVar14 * 2],1);
            if (lVar14 == 4 && pvVar20 == (void *)0x1) {
              mpp_put_align((BitputCtx_t *)&ref,0x40,0);
            }
            mpp_put_bits((BitputCtx_t *)&ref,(ulong)pRVar8[lVar14 * 2 + -1],4);
          }
          pRVar8 = pRVar8 + 0x1e;
          pvVar20 = (void *)((long)local_9a18 + 1);
        }
        bVar4 = lowdelay_flag[local_9a20];
        mpp_put_bits((BitputCtx_t *)&ref,(ulong)bVar4,1);
        if (((byte)hal_h265d_debug & 2) != 0) {
          _mpp_log_l(4,"hal_h265d_com","lowdelay_flag = %d \n",(char *)0x0,(ulong)bVar4);
        }
        bVar4 = rps_bit_offset[uVar17];
        mpp_put_bits((BitputCtx_t *)&ref,(ulong)bVar4,10);
        if (((byte)hal_h265d_debug & 2) != 0) {
          _mpp_log_l(4,"hal_h265d_com","rps_bit_offset = %d \n",(char *)0x0,(ulong)bVar4);
        }
        bVar4 = rps_bit_offset_st[uVar17];
        mpp_put_bits((BitputCtx_t *)&ref,(ulong)bVar4,9);
        if (((byte)hal_h265d_debug & 2) != 0) {
          _mpp_log_l(4,"hal_h265d_com","rps_bit_offset_st = %d \n",(char *)0x0,(ulong)bVar4);
        }
        bVar4 = slice_nb_rps_poc[uVar17];
        mpp_put_bits((BitputCtx_t *)&ref,(ulong)bVar4,4);
        if (((byte)hal_h265d_debug & 2) != 0) {
          _mpp_log_l(4,"hal_h265d_com","slice_nb_rps_poc = %d \n",(char *)0x0,(ulong)bVar4);
        }
        mpp_put_align((BitputCtx_t *)&ref,0x40,0);
        pRVar8 = local_9a28 + 0x3c;
      }
      if (rps_buf != (void *)0x0) {
        memcpy(rps_buf,local_9a38,(long)((int)local_9a30 << 5));
      }
      mpp_osal_free("hal_h265d_slice_output_rps",ptr);
      return 0;
    }
    memset(&local_99a8,0,0x2c8);
    local_9a20 = uVar17;
    mpp_set_bitread_ctx(&gb_cxt,(RK_U8 *)((ulong)*(uint *)(*(long *)((long)dxva + 0x1e58) +
                                                          uVar17 * 0xc) +
                                         *(long *)((long)dxva + 0x1e60)),
                        *(RK_S32 *)(*(long *)((long)dxva + 0x1e58) + 4 + uVar17 * 0xc));
    mpp_set_bitread_pseudo_code_type(&gb_cxt,PSEUDO_CODE_H264_H265);
    gb_cxt.ret = mpp_read_bits(&gb_cxt,1,&_out);
    if (gb_cxt.ret != MPP_OK) {
      return -0x3ec;
    }
    if (_out != 0) {
      return -0x3ec;
    }
    gb_cxt.ret = mpp_read_bits(&gb_cxt,6,&_out);
    RVar6 = _out;
    if (gb_cxt.ret != MPP_OK) {
      return -0x3ec;
    }
    local_9a18 = (void *)(ulong)(uint)_out;
    MVar5 = MPP_OK;
    if ((uint)_out < 0x18) {
      gb_cxt.ret = mpp_skip_longbits(&gb_cxt,9);
      if (gb_cxt.ret != MPP_OK) {
        return -0x3ec;
      }
      gb_cxt.ret = mpp_read_bits(&gb_cxt,1,&_out);
      if (gb_cxt.ret != MPP_OK) {
        return -0x3ec;
      }
      RVar3 = (RK_U8)_out;
      local_99a8.first_slice_in_pic_flag = (RK_U8)_out;
      if (0xf < (uint)RVar6) {
        MVar5 = mpp_read_bits(&gb_cxt,1,&_out);
        if (MVar5 != MPP_OK) {
          return -0x3ec;
        }
        local_99a8.no_output_of_prior_pics_flag = (RK_U8)_out;
      }
      gb_cxt.ret = MPP_OK;
      gb_cxt.ret = mpp_read_ue(&gb_cxt,(RK_U32 *)&_out);
      if (gb_cxt.ret != MPP_OK) {
        return -0x3ec;
      }
      local_99a8.pps_id = _out;
      if (0x3f < (uint)_out) {
        pcVar11 = "PPS id out of range: %d\n";
        goto LAB_001f02ac;
      }
      local_99a8.dependent_slice_segment_flag = '\0';
      if (RVar3 == '\0') {
        bVar9 = *(char *)((long)dxva + 8) + 3;
        uVar1 = *dxva;
        bVar4 = *(char *)((long)dxva + 8) + *(char *)((long)dxva + 9) + 3;
        uVar2 = *(ushort *)((long)dxva + 2);
        uVar12 = ~(-1 << (bVar4 & 0x1f));
        bVar21 = true;
        if ((*(byte *)((long)dxva + 0x1a) & 0x10) != 0) {
          MVar5 = mpp_read_bits(&gb_cxt,1,&_out);
          if (MVar5 != MPP_OK) {
            return -0x3ec;
          }
          local_99a8.dependent_slice_segment_flag = (RK_U8)_out;
          bVar21 = (RK_U8)_out == '\0';
        }
        gb_cxt.ret = MPP_OK;
        uVar12 = ((int)(((uint)uVar1 << (bVar9 & 0x1f)) + uVar12) >> (bVar4 & 0x1f)) *
                 ((int)(uVar12 + ((uint)uVar2 << (bVar9 & 0x1f))) >> (bVar4 & 0x1f));
        RVar6 = mpp_ceil_log2(uVar12);
        MVar5 = mpp_read_bits(&gb_cxt,RVar6,&_out);
        if (MVar5 != MPP_OK) {
          return -0x3ec;
        }
        local_99a8.slice_segment_addr = _out;
        if (uVar12 <= (uint)_out) {
          pcVar11 = "Invalid slice segment address: %u.\n";
          goto LAB_001f02ac;
        }
        MVar5 = MPP_OK;
        if (!bVar21) goto LAB_001ef837;
        local_99a8.slice_addr = _out;
        local_9a28 = (RK_U8 *)(ulong)((int)local_9a28 + 1);
      }
      else {
        local_99a8.slice_segment_addr = 0;
        local_99a8.slice_addr = 0;
        local_9a28 = (RK_U8 *)0x0;
      }
      gb_cxt.ret = MPP_OK;
      uVar12 = 0xffffffff;
      while (uVar12 = uVar12 + 1, uVar12 < (*(uint *)((long)dxva + 0x18) >> 0x16 & 7)) {
        gb_cxt.ret = mpp_skip_longbits(&gb_cxt,1);
        if (gb_cxt.ret != MPP_OK) {
          return -0x3ec;
        }
      }
      gb_cxt.ret = mpp_read_ue(&gb_cxt,(RK_U32 *)&_out);
      pvVar20 = local_9a18;
      if (gb_cxt.ret != MPP_OK) {
        return -0x3ec;
      }
      local_99a8.slice_type = _out;
      if (2 < (uint)_out) {
        pcVar11 = "Unknown slice type: %d.\n";
LAB_001f02ac:
        gb_cxt.ret = MPP_OK;
        _mpp_log_l(2,"hal_h265d_com",pcVar11,(char *)0x0);
        return -0x3ec;
      }
      local_9a30 = CONCAT44(local_9a30._4_4_,_out);
      if ((*(byte *)((long)dxva + 0x1a) & 0x20) != 0) {
        MVar5 = mpp_read_bits(&gb_cxt,1,&_out);
        if (MVar5 != MPP_OK) {
          return -0x3ec;
        }
        local_99a8.pic_output_flag = (RK_U8)_out;
      }
      gb_cxt.ret = MPP_OK;
      if ((*(byte *)((long)dxva + 4) & 4) != 0) {
        MVar5 = mpp_read_bits(&gb_cxt,2,&_out);
        if (MVar5 != MPP_OK) {
          return -0x3ec;
        }
        local_99a8.colour_plane_id = (RK_U8)_out;
      }
      gb_cxt.ret = MPP_OK;
      lVar14 = (long)(int)local_9a28;
      if ((int)pvVar20 - 0x13U < 2) {
        local_99a8.short_term_rps = (ShortTermRPS_conflict *)0x0;
      }
      else {
        gb_cxt.ret = mpp_read_bits(&gb_cxt,(*(uint *)((long)dxva + 4) >> 9 & 0xf) + 4,&_out);
        if (gb_cxt.ret != MPP_OK) {
          return -0x3ec;
        }
        local_99a8.pic_order_cnt_lsb = _out;
        gb_cxt.ret = mpp_read_bits(&gb_cxt,1,&_out);
        RVar6 = gb_cxt.used_bits;
        if (gb_cxt.ret != MPP_OK) {
          return -0x3ec;
        }
        if (_out == 0) {
          gb_cxt.ret = mpp_skip_longbits(&gb_cxt,(uint)*(ushort *)((long)dxva + 0x14));
LAB_001efb40:
          if (gb_cxt.ret != MPP_OK) {
            return -0x3ec;
          }
        }
        else {
          if (*(byte *)((long)dxva + 0xe) == 0) {
            pcVar11 = "No ref lists in the SPS.\n";
            gb_cxt.ret = MPP_OK;
            goto LAB_001f030c;
          }
          num_bits = mpp_ceil_log2((uint)*(byte *)((long)dxva + 0xe));
          if (0 < num_bits) {
            gb_cxt.ret = mpp_read_bits(&gb_cxt,num_bits,&_out);
            goto LAB_001efb40;
          }
        }
        iVar19 = gb_cxt.used_bits - RVar6;
        rps_bit_offset_st[lVar14] = (RK_U8)iVar19;
        rps_bit_offset[lVar14] = (RK_U8)iVar19;
        uVar12 = *(uint *)((long)dxva + 0x18);
        if ((uVar12 >> 0x11 & 1) != 0) {
          local_9a10 = gb_cxt.used_bits;
          local_9a0c = iVar19;
          if (*(char *)((long)dxva + 0xf) == '\0') {
            local_9a38 = (RK_U64 *)((ulong)local_9a38 & 0xffffffff00000000);
          }
          else {
            MVar5 = mpp_read_ue(&gb_cxt,(RK_U32 *)&_out);
            if (MVar5 != MPP_OK) {
              return -0x3ec;
            }
            local_9a38 = (RK_U64 *)CONCAT44(local_9a38._4_4_,_out);
            gb_cxt.ret = MPP_OK;
          }
          MVar5 = mpp_read_ue(&gb_cxt,(RK_U32 *)&_out);
          if (MVar5 != MPP_OK) {
            return -0x3ec;
          }
          uVar12 = _out + (uint)local_9a38;
          gb_cxt.ret = MPP_OK;
          for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
            if (uVar18 < (uint)local_9a38) {
              if (1 < *(byte *)((long)dxva + 0xf)) {
                RVar6 = mpp_ceil_log2((uint)*(byte *)((long)dxva + 0xf));
                gb_cxt.ret = mpp_read_bits(&gb_cxt,RVar6,&_out);
                goto LAB_001efc30;
              }
            }
            else {
              gb_cxt.ret = mpp_skip_longbits(&gb_cxt,(*(uint *)((long)dxva + 4) >> 9 & 0xf) + 4);
              if (gb_cxt.ret != MPP_OK) {
                return -0x3ec;
              }
              gb_cxt.ret = mpp_skip_longbits(&gb_cxt,1);
LAB_001efc30:
              if (gb_cxt.ret != MPP_OK) {
                return -0x3ec;
              }
            }
            gb_cxt.ret = mpp_read_bits(&gb_cxt,1,&_out);
            if (gb_cxt.ret != MPP_OK) {
              return -0x3ec;
            }
            MVar5 = MPP_OK;
            if (((RK_U8)_out != '\0') &&
               (MVar5 = mpp_read_ue(&gb_cxt,(RK_U32 *)&_out), MVar5 != MPP_OK)) {
              return -0x3ec;
            }
            gb_cxt.ret = MVar5;
          }
          rps_bit_offset[lVar14] = ((char)gb_cxt.used_bits - (char)local_9a10) + (char)local_9a0c;
          uVar12 = *(uint *)((long)dxva + 0x18);
        }
        if ((uVar12 >> 0x12 & 1) == 0) {
          local_99a8.slice_temporal_mvp_enabled_flag = '\0';
        }
        else {
          MVar5 = mpp_read_bits(&gb_cxt,1,&_out);
          if (MVar5 != MPP_OK) {
            return -0x3ec;
          }
          local_99a8.slice_temporal_mvp_enabled_flag = (RK_U8)_out;
          gb_cxt.ret = MPP_OK;
        }
      }
      if ((*(byte *)((long)dxva + 0x18) & 4) == 0) {
        local_99a8.slice_sample_adaptive_offset_flag[0] = '\0';
        local_99a8.slice_sample_adaptive_offset_flag[1] = '\0';
        local_99a8.slice_sample_adaptive_offset_flag[2] = '\0';
      }
      else {
        gb_cxt.ret = mpp_read_bits(&gb_cxt,1,&_out);
        if (gb_cxt.ret != MPP_OK) {
          return -0x3ec;
        }
        local_99a8.slice_sample_adaptive_offset_flag[0] = (RK_U8)_out;
        MVar5 = mpp_read_bits(&gb_cxt,1,&_out);
        if (MVar5 != MPP_OK) {
          return -0x3ec;
        }
        local_99a8.slice_sample_adaptive_offset_flag[1] = (RK_U8)_out;
        gb_cxt.ret = MPP_OK;
        local_99a8.slice_sample_adaptive_offset_flag[2] = (RK_U8)_out;
      }
      local_99a8.nb_refs[0] = 0;
      local_99a8.nb_refs[1] = 0;
      MVar5 = gb_cxt.ret;
      if ((int)local_9a30 != 2) {
        local_99a8.nb_refs[0] = *(byte *)((long)dxva + 0x10) + 1;
        local_9a38 = (RK_U64 *)CONCAT44(local_9a38._4_4_,local_99a8.nb_refs[0]);
        local_99a8.nb_refs[1] = 0;
        uVar12 = 0;
        if ((int)local_9a30 == 0) {
          uVar12 = *(byte *)((long)dxva + 0x11) + 1;
          local_99a8.nb_refs[1] = uVar12;
        }
        gb_cxt.ret = mpp_read_bits(&gb_cxt,1,&_out);
        if (gb_cxt.ret != MPP_OK) {
          return -0x3ec;
        }
        if (_out != 0) {
          gb_cxt.ret = mpp_read_ue(&gb_cxt,(RK_U32 *)&_out);
          if (gb_cxt.ret != MPP_OK) {
            return -0x3ec;
          }
          local_9a38 = (RK_U64 *)CONCAT44(local_9a38._4_4_,_out + 1U);
          local_99a8.nb_refs[0] = _out + 1U;
          if ((int)local_9a30 == 0) {
            MVar5 = mpp_read_ue(&gb_cxt,(RK_U32 *)&_out);
            if (MVar5 != MPP_OK) {
              return -0x3ec;
            }
            uVar12 = _out + 1;
            local_99a8.nb_refs[1] = uVar12;
          }
        }
        gb_cxt.ret = MPP_OK;
        if ((0x10 < (uint)local_9a38) || (0x10 < uVar12)) {
          _mpp_log_l(2,"hal_h265d_com","Too many refs: %d/%d.\n",(char *)0x0,
                     (ulong)local_9a38 & 0xffffffff,(ulong)uVar12);
          return -0x3ec;
        }
        local_99a8.rpl_modification_flag[0] = '\0';
        local_99a8.rpl_modification_flag[1] = '\0';
        iVar19 = 0;
        for (lVar13 = 0x7c; lVar13 != 0x8b; lVar13 = lVar13 + 1) {
          if (*(char *)((long)dxva + lVar13) != -1) {
            if (((byte)hal_h265d_debug & 2) != 0) {
              _mpp_log_l(4,"hal_h265d_com","dxva_cxt->pp.RefPicList[i].bPicEntry = %d",(char *)0x0);
            }
            iVar19 = iVar19 + 1;
          }
        }
        if (iVar19 == 0) {
          pcVar11 = "Zero refs for a frame with P or B slices.\n";
LAB_001f030c:
          _mpp_log_l(2,"hal_h265d_com",pcVar11,(char *)0x0);
          return -0x3ec;
        }
        if ((iVar19 != 1 & *(byte *)((long)dxva + 0x1d) >> 6) == 1) {
          MVar5 = mpp_read_bits(&gb_cxt,1,&_out);
          if (MVar5 != MPP_OK) {
            return -0x3ec;
          }
          local_99a8.rpl_modification_flag[0] = (RK_U8)_out;
          if ((RK_U8)_out != '\0') {
            RVar7 = (uint)local_9a38;
            for (uVar17 = 0; gb_cxt.ret = MPP_OK, uVar17 < RVar7; uVar17 = uVar17 + 1) {
              RVar6 = mpp_ceil_log2(iVar19);
              MVar5 = mpp_read_bits(&gb_cxt,RVar6,&_out);
              if (MVar5 != MPP_OK) {
                return -0x3ec;
              }
              local_99a8.list_entry_lx[0][uVar17] = _out;
              RVar7 = local_99a8.nb_refs[0];
            }
          }
          gb_cxt.ret = MPP_OK;
          if ((int)local_9a30 == 0) {
            MVar5 = mpp_read_bits(&gb_cxt,1,&_out);
            if (MVar5 != MPP_OK) {
              return -0x3ec;
            }
            local_99a8.rpl_modification_flag[1] = (RK_U8)_out;
            local_9a30 = local_9a30 & 0xffffffff00000000;
            gb_cxt.ret = MPP_OK;
            if ((RK_U8)_out == '\x01') {
              for (uVar17 = 0; gb_cxt.ret = MPP_OK, uVar17 < (ulong)local_99a8.nb_refs >> 0x20;
                  uVar17 = uVar17 + 1) {
                RVar6 = mpp_ceil_log2(iVar19);
                MVar5 = mpp_read_bits(&gb_cxt,RVar6,&_out);
                if (MVar5 != MPP_OK) {
                  return -0x3ec;
                }
                local_99a8.list_entry_lx[1][uVar17] = _out;
              }
            }
          }
        }
        MVar5 = gb_cxt.ret;
        if ((int)local_9a30 != 2) {
          uVar12 = 2 - (int)local_9a30;
          hal_h265d_slice_rpl(dxva,&local_99a8,&ref);
          lowdelay_flag[lVar14] = '\x01';
          pRVar8 = &rps_pic_info[lVar14][0][0].is_long_term;
          pRVar10 = ref.refPicList;
          for (uVar17 = 0; uVar17 != uVar12; uVar17 = uVar17 + 1) {
            uVar18 = ref.refPicList[uVar17].nb_refs;
            for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
              bVar4 = (byte)((RefPicList_t *)pRVar10->dpb_index)->dpb_index[uVar15];
              uVar16 = (ulong)bVar4;
              if (uVar16 != 0xff) {
                pRVar8[uVar15 * 2 + -1] = bVar4;
                pRVar8[uVar15 * 2] = *(byte *)((long)dxva + uVar16 + 0x7c) >> 7;
                if (*(int *)((long)dxva + 0x78) < *(int *)((long)dxva + uVar16 * 4 + 0x8c)) {
                  lowdelay_flag[lVar14] = '\0';
                }
              }
            }
            pRVar10 = pRVar10 + 1;
            pRVar8 = pRVar8 + 0x1e;
          }
          slice_nb_rps_poc[lVar14] = (RK_U8)iVar19;
          MVar5 = gb_cxt.ret;
        }
      }
    }
LAB_001ef837:
    gb_cxt.ret = MVar5;
    uVar17 = local_9a20 + 1;
  } while( true );
}

Assistant:

RK_S32 hal_h265d_slice_output_rps(void *dxva, void *rps_buf)
{
    RK_U32 i, j, k;
    RK_S32 value;
    RK_U32 nal_type;
    RK_S32 slice_idx = 0;
    BitReadCtx_t gb_cxt, *gb;
    SliceHeader_t sh;
    RK_U8     rps_bit_offset[600];
    RK_U8     rps_bit_offset_st[600];
    RK_U8     slice_nb_rps_poc[600];
    RK_U8     lowdelay_flag[600];
    slice_ref_map_t rps_pic_info[600][2][15];
    RK_U32    nb_refs = 0;
    RK_S32    bit_begin;
    h265d_dxva2_picture_context_t *dxva_cxt = NULL;

    memset(&rps_pic_info,   0, sizeof(rps_pic_info));
    memset(&slice_nb_rps_poc, 0, sizeof(slice_nb_rps_poc));
    memset(&rps_bit_offset, 0, sizeof(rps_bit_offset));
    memset(&rps_bit_offset_st, 0, sizeof(rps_bit_offset_st));
    memset(&lowdelay_flag, 0, sizeof(lowdelay_flag));

    dxva_cxt = (h265d_dxva2_picture_context_t*)dxva;
    for (k = 0; k < dxva_cxt->slice_count; k++) {
        RefPicListTab_t ref;
        memset(&sh, 0, sizeof(SliceHeader_t));
        // mpp_err("data[%d]= 0x%x,size[%d] = %d \n",
        //   k,dxva_cxt->slice_short[k].BSNALunitDataLocation, k,dxva_cxt->slice_short[k].SliceBytesInBuffer);
        mpp_set_bitread_ctx(&gb_cxt, (RK_U8*)(dxva_cxt->bitstream + dxva_cxt->slice_short[k].BSNALunitDataLocation),
                            dxva_cxt->slice_short[k].SliceBytesInBuffer);

        mpp_set_bitread_pseudo_code_type(&gb_cxt, PSEUDO_CODE_H264_H265);
        gb = &gb_cxt;

        READ_ONEBIT(gb, &value);

        if ( value != 0)
            return  MPP_ERR_STREAM;

        READ_BITS(gb, 6, &nal_type);

        if (nal_type > 23) {
            continue;
        }

        SKIP_BITS(gb, 9);

        READ_ONEBIT(gb, &sh.first_slice_in_pic_flag);

        if (nal_type >= 16 && nal_type <= 23)
            READ_ONEBIT(gb, &sh.no_output_of_prior_pics_flag);

        READ_UE(gb, &sh.pps_id);

        if (sh.pps_id >= 64 ) {
            mpp_err( "PPS id out of range: %d\n", sh.pps_id);
            return  MPP_ERR_STREAM;
        }

        sh.dependent_slice_segment_flag = 0;
        if (!sh.first_slice_in_pic_flag) {
            RK_S32 slice_address_length;
            RK_S32 width, height, ctb_width, ctb_height;
            RK_S32 log2_min_cb_size = dxva_cxt->pp.log2_min_luma_coding_block_size_minus3 + 3;
            RK_S32 log2_ctb_size = log2_min_cb_size + dxva_cxt->pp.log2_diff_max_min_luma_coding_block_size;

            width = (dxva_cxt->pp.PicWidthInMinCbsY << log2_min_cb_size);
            height = (dxva_cxt->pp.PicHeightInMinCbsY << log2_min_cb_size);

            ctb_width  = (width  + (1 << log2_ctb_size) - 1) >> log2_ctb_size;
            ctb_height = (height + (1 << log2_ctb_size) - 1) >> log2_ctb_size;

            if (dxva_cxt->pp.dependent_slice_segments_enabled_flag)
                READ_ONEBIT(gb, &sh.dependent_slice_segment_flag);

            slice_address_length = mpp_ceil_log2(ctb_width * ctb_height);

            READ_BITS(gb, slice_address_length, &sh.slice_segment_addr);

            if (sh.slice_segment_addr >= (RK_U32)(ctb_width * ctb_height)) {
                mpp_err(
                    "Invalid slice segment address: %u.\n",
                    sh.slice_segment_addr);
                return  MPP_ERR_STREAM;
            }

            if (!sh.dependent_slice_segment_flag) {
                sh.slice_addr = sh.slice_segment_addr;
                slice_idx++;
            }
        } else {
            sh.slice_segment_addr = sh.slice_addr = 0;
            slice_idx           = 0;
        }

        if (!sh.dependent_slice_segment_flag) {
            for (i = 0; i < dxva_cxt->pp.num_extra_slice_header_bits; i++)
                SKIP_BITS(gb, 1);

            READ_UE(gb, &sh.slice_type);
            if (!(sh.slice_type == I_SLICE ||
                  sh.slice_type == P_SLICE ||
                  sh.slice_type == B_SLICE)) {
                mpp_err( "Unknown slice type: %d.\n",
                         sh.slice_type);
                return  MPP_ERR_STREAM;
            }
            /*     if (!s->decoder_id && IS_IRAP(nal_type) && sh->slice_type != I_SLICE) {
                     mpp_err( "Inter slices in an IRAP frame.\n");
                     return  MPP_ERR_STREAM;
                 }*/

            if (dxva_cxt->pp.output_flag_present_flag)
                READ_ONEBIT(gb, &sh.pic_output_flag);

            if (dxva_cxt->pp.separate_colour_plane_flag)
                READ_BITS(gb, 2, &sh.colour_plane_id );

            if (!IS_IDR(nal_type)) {
                int short_term_ref_pic_set_sps_flag;

                READ_BITS(gb, (dxva_cxt->pp.log2_max_pic_order_cnt_lsb_minus4 + 4), &sh.pic_order_cnt_lsb);

                READ_ONEBIT(gb, &short_term_ref_pic_set_sps_flag);

                bit_begin = gb->used_bits;

                if (!short_term_ref_pic_set_sps_flag) {
                    SKIP_BITS(gb, dxva_cxt->pp.wNumBitsForShortTermRPSInSlice);
                } else {
                    RK_S32 numbits, rps_idx;
                    if (!dxva_cxt->pp.num_short_term_ref_pic_sets) {
                        mpp_err( "No ref lists in the SPS.\n");
                        return  MPP_ERR_STREAM;
                    }
                    numbits = mpp_ceil_log2(dxva_cxt->pp.num_short_term_ref_pic_sets);
                    rps_idx = 0;
                    if (numbits > 0)
                        READ_BITS(gb, numbits, &rps_idx);
                }

                rps_bit_offset_st[slice_idx] = gb->used_bits - bit_begin;
                rps_bit_offset[slice_idx] = rps_bit_offset_st[slice_idx];
                if (dxva_cxt->pp.long_term_ref_pics_present_flag) {

//                    RK_S32 max_poc_lsb    = 1 << (dxva_cxt->pp.log2_max_pic_order_cnt_lsb_minus4 + 4);
                    RK_U32 nb_sps = 0, nb_sh;

                    bit_begin = gb->used_bits;
                    if (dxva_cxt->pp.num_long_term_ref_pics_sps > 0)
                        READ_UE(gb, &nb_sps);

                    READ_UE(gb, &nb_sh);

                    nb_refs = nb_sh + nb_sps;

                    for (i = 0; i < nb_refs; i++) {
                        RK_U8 delta_poc_msb_present;

                        if ((RK_U32)i < nb_sps) {
                            RK_U8 lt_idx_sps = 0;

                            if (dxva_cxt->pp.num_long_term_ref_pics_sps > 1)
                                READ_BITS(gb, mpp_ceil_log2(dxva_cxt->pp.num_long_term_ref_pics_sps), &lt_idx_sps);
                        } else {
                            SKIP_BITS(gb, (dxva_cxt->pp.log2_max_pic_order_cnt_lsb_minus4 + 4));
                            SKIP_BITS(gb, 1);
                        }

                        READ_ONEBIT(gb, &delta_poc_msb_present);
                        if (delta_poc_msb_present) {
                            RK_S32 delta = 0;
                            READ_UE(gb, &delta);
                        }
                    }
                    rps_bit_offset[slice_idx] += (gb->used_bits - bit_begin);

                }

                if (dxva_cxt->pp.sps_temporal_mvp_enabled_flag)
                    READ_ONEBIT(gb, &sh.slice_temporal_mvp_enabled_flag);
                else
                    sh.slice_temporal_mvp_enabled_flag = 0;
            } else {
                sh.short_term_rps = NULL;
            }

            if (dxva_cxt->pp.sample_adaptive_offset_enabled_flag) {
                READ_ONEBIT(gb, &sh.slice_sample_adaptive_offset_flag[0]);
                READ_ONEBIT(gb, &sh.slice_sample_adaptive_offset_flag[1]);
                sh.slice_sample_adaptive_offset_flag[2] =
                    sh.slice_sample_adaptive_offset_flag[1];
            } else {
                sh.slice_sample_adaptive_offset_flag[0] = 0;
                sh.slice_sample_adaptive_offset_flag[1] = 0;
                sh.slice_sample_adaptive_offset_flag[2] = 0;
            }

            sh.nb_refs[L0] = sh.nb_refs[L1] = 0;
            if (sh.slice_type == P_SLICE || sh.slice_type == B_SLICE) {

                sh.nb_refs[L0] = dxva_cxt->pp.num_ref_idx_l0_default_active_minus1 + 1;
                if (sh.slice_type == B_SLICE)
                    sh.nb_refs[L1] =  dxva_cxt->pp.num_ref_idx_l1_default_active_minus1 + 1;

                READ_ONEBIT(gb, &value);

                if (value) { // num_ref_idx_active_override_flag
                    READ_UE(gb, &sh.nb_refs[L0]);
                    sh.nb_refs[L0] += 1;
                    if (sh.slice_type == B_SLICE) {
                        READ_UE(gb, &sh.nb_refs[L1]);
                        sh.nb_refs[L1] += 1;
                    }
                }
                if (sh.nb_refs[L0] > MAX_REFS || sh.nb_refs[L1] > MAX_REFS) {
                    mpp_err( "Too many refs: %d/%d.\n",
                             sh.nb_refs[L0], sh.nb_refs[L1]);
                    return  MPP_ERR_STREAM;
                }

                sh.rpl_modification_flag[0] = 0;
                sh.rpl_modification_flag[1] = 0;
                nb_refs = 0;
                for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dxva_cxt->pp.RefPicList); i++) {
                    if (dxva_cxt->pp.RefPicList[i].bPicEntry != 0xff) {
                        h265h_dbg(H265H_DBG_RPS, "dxva_cxt->pp.RefPicList[i].bPicEntry = %d", dxva_cxt->pp.RefPicList[i].bPicEntry);
                        nb_refs++;
                    }
                }

                if (!nb_refs) {
                    mpp_err( "Zero refs for a frame with P or B slices.\n");
                    return  MPP_ERR_STREAM;
                }

                if (dxva_cxt->pp.lists_modification_present_flag && nb_refs > 1) {
                    READ_ONEBIT(gb, &sh.rpl_modification_flag[0]);
                    if (sh.rpl_modification_flag[0]) {
                        for (i = 0; (RK_U32)i < sh.nb_refs[L0]; i++)
                            READ_BITS(gb, mpp_ceil_log2(nb_refs), &sh.list_entry_lx[0][i]);
                    }

                    if (sh.slice_type == B_SLICE) {
                        READ_ONEBIT(gb, &sh.rpl_modification_flag[1]);
                        if (sh.rpl_modification_flag[1] == 1)
                            for (i = 0; (RK_U32)i < sh.nb_refs[L1]; i++)
                                READ_BITS(gb, mpp_ceil_log2(nb_refs), &sh.list_entry_lx[1][i]);
                    }
                }
            }
        }

        if (!sh.dependent_slice_segment_flag &&
            sh.slice_type != I_SLICE) {
            RK_U32 nb_list = I_SLICE - sh.slice_type;

            hal_h265d_slice_rpl(dxva, &sh, &ref);
            lowdelay_flag[slice_idx]  =  1;

            for (j = 0; j < nb_list; j++) {
                for (i = 0; i < ref.refPicList[j].nb_refs; i++) {
                    RK_U8 index = 0;
                    index = ref.refPicList[j].dpb_index[i];
                    // mpp_err("slice_idx = %d index = %d,j = %d i = %d",slice_idx,index,j,i);
                    if (index != 0xff) {
                        rps_pic_info[slice_idx][j][i].dpb_index = index;
                        rps_pic_info[slice_idx][j][i].is_long_term
                            = dxva_cxt->pp.RefPicList[index].AssociatedFlag;
                        if (dxva_cxt->pp.PicOrderCntValList[index] > dxva_cxt->pp.CurrPicOrderCntVal)
                            lowdelay_flag[slice_idx] = 0;
                    }
                }
            }

            if (sh.slice_type == I_SLICE)
                slice_nb_rps_poc[slice_idx] = 0;
            else
                slice_nb_rps_poc[slice_idx] = nb_refs;

        }
    }
//out put for rk format
    {
        RK_S32  nb_slice = slice_idx + 1;
        RK_S32  fifo_len   = nb_slice * 4 + 1;//size of rps_packet alloc more 1 64 bit invoid buffer no enought
        RK_U64 *rps_packet = mpp_malloc(RK_U64, fifo_len);
        BitputCtx_t bp;
        mpp_set_bitput_ctx(&bp, rps_packet, fifo_len);
        for (k = 0; k < (RK_U32)nb_slice; k++) {
            for (j = 0; j < 2; j++) {
                for (i = 0; i < 15; i++) {
                    mpp_put_bits(&bp, rps_pic_info[k][j][i].is_long_term, 1);
                    if (j == 1 && i == 4) {
                        mpp_put_align (&bp, 64, 0);
                    }
                    mpp_put_bits(&bp, rps_pic_info[k][j][i].dpb_index,    4);
                }
            }
            mpp_put_bits(&bp, lowdelay_flag      [k], 1);
            h265h_dbg(H265H_DBG_RPS, "lowdelay_flag = %d \n", lowdelay_flag[k]);
            mpp_put_bits(&bp, rps_bit_offset     [k], 10);

            h265h_dbg(H265H_DBG_RPS, "rps_bit_offset = %d \n", rps_bit_offset[k]);
            mpp_put_bits(&bp, rps_bit_offset_st  [k], 9);

            h265h_dbg(H265H_DBG_RPS, "rps_bit_offset_st = %d \n", rps_bit_offset_st[k]);
            mpp_put_bits(&bp, slice_nb_rps_poc   [k], 4);

            h265h_dbg(H265H_DBG_RPS, "slice_nb_rps_poc = %d \n", slice_nb_rps_poc[k]);
            mpp_put_align   (&bp, 64, 0);
        }
        if (rps_buf != NULL) {
            memcpy(rps_buf, rps_packet, nb_slice * 32);
        }
        mpp_free(rps_packet);
    }

    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}